

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChClassFactory.h
# Opt level: O2

void * __thiscall
chrono::ChClassRegistration<chrono::ChConstraintTwoGeneric>::create
          (ChClassRegistration<chrono::ChConstraintTwoGeneric> *this,ChArchiveIn *marchive)

{
  type pvVar1;
  
  pvVar1 = _archive_in_create<chrono::ChConstraintTwoGeneric>(this,marchive);
  return pvVar1;
}

Assistant:

virtual void* create(ChArchiveIn& marchive) {
        return _archive_in_create(marchive);
    }